

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonahanPlanner.cpp
# Opt level: O1

size_t __thiscall MonahanPlanner::GetNrVectors(MonahanPlanner *this)

{
  pointer pvVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  pvVar1 = (this->_m_qFunction).
           super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = 0;
  lVar4 = (long)(this->_m_qFunction).
                super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
  if (lVar4 == 0) {
    sVar2 = 0;
  }
  else {
    uVar5 = (lVar4 >> 3) * -0x5555555555555555;
    sVar2 = 0;
    do {
      uVar6 = uVar5;
      uVar9 = uVar8;
      if (uVar5 < uVar8 || uVar5 - uVar8 == 0) {
LAB_003b9b92:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9
                   ,uVar6);
      }
      lVar4 = *(long *)&pvVar1[uVar8].
                        super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                        ._M_impl.super__Vector_impl_data;
      uVar3 = ((long)*(pointer *)
                      ((long)&pvVar1[uVar8].
                              super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                              ._M_impl.super__Vector_impl_data + 8) - lVar4 >> 3) *
              -0x5555555555555555;
      uVar7 = 1;
      uVar10 = 0;
      while( true ) {
        bVar11 = uVar3 - uVar10 == 0;
        if (bVar11) break;
        uVar6 = uVar3;
        uVar9 = uVar10;
        if (uVar3 < uVar10 || bVar11) goto LAB_003b9b92;
        sVar2 = sVar2 + (*(long *)(lVar4 + 8 + uVar10 * 0x18) - *(long *)(lVar4 + uVar10 * 0x18) >>
                        3) * -0x3333333333333333;
        uVar10 = (ulong)uVar7;
        uVar7 = uVar7 + 1;
        uVar6 = uVar5;
        uVar9 = uVar8;
        if (uVar5 < uVar8 || uVar5 - uVar8 == 0) goto LAB_003b9b92;
      }
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (uVar5 - uVar8 != 0);
  }
  return sVar2;
}

Assistant:

size_t MonahanPlanner::GetNrVectors() const
{
    size_t k=0;
    for(Index t=0;t!=_m_qFunction.size();++t)
        for(Index a=0;a!=_m_qFunction.at(t).size();++a)
            k+=_m_qFunction.at(t).at(a).size();

    return(k);
}